

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

FilePath * testing::internal::GetCurrentExecutableName(void)

{
  size_type *psVar1;
  FilePath *in_RDI;
  FilePath local_58;
  undefined1 local_38 [8];
  FilePath result;
  
  psVar1 = &result.pathname_._M_string_length;
  result.pathname_._M_dataplus._M_p = (pointer)0x0;
  result.pathname_._M_string_length._0_1_ = 0;
  local_38 = (undefined1  [8])psVar1;
  FilePath::FilePath(&local_58,g_argvs_abi_cxx11_);
  std::__cxx11::string::_M_assign((string *)local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.pathname_._M_dataplus._M_p != &local_58.pathname_.field_2) {
    operator_delete(local_58.pathname_._M_dataplus._M_p);
  }
  FilePath::RemoveDirectoryName(in_RDI,(FilePath *)local_38);
  if (local_38 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_38);
  }
  return in_RDI;
}

Assistant:

FilePath GetCurrentExecutableName() {
  FilePath result;

#if GTEST_OS_WINDOWS
  result.Set(FilePath(GetArgvs()[0]).RemoveExtension("exe"));
#else
  result.Set(FilePath(GetArgvs()[0]));
#endif  // GTEST_OS_WINDOWS

  return result.RemoveDirectoryName();
}